

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_4xx0_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint uVar1;
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  uVar1 = quads[1];
  if (uVar1 == 0) {
    sh4asm_txt_shll_rn(em,quads[2]);
  }
  else if (uVar1 == 1) {
    sh4asm_txt_dt_rn(em,quads[2]);
  }
  else if (uVar1 == 2) {
    sh4asm_txt_shal_rn(em,quads[2]);
  }
  else {
    sh4asm_opcode_non_inst_(quads,em);
  }
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_4xx0_(unsigned const *quads,
                   sh4asm_disas_emit_func em, uint32_t pc) {
    switch (quads[1]) {
    case 0:
        sh4asm_txt_shll_rn(em, quads[2]);
        break;
    case 1:
        sh4asm_txt_dt_rn(em, quads[2]);
        break;
    case 2:
        sh4asm_txt_shal_rn(em, quads[2]);
        break;
    default:
        sh4asm_opcode_non_inst_(quads, em);
    }
}